

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_Compose_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFunc,Aig_Obj_t *pVar)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *local_30;
  Aig_Obj_t *pVar_local;
  Aig_Obj_t *pFunc_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x3ac,"void Aig_Compose_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)")
    ;
  }
  iVar1 = Aig_ObjIsMarkA(pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsConst1(pObj);
    if ((iVar1 == 0) && (iVar1 = Aig_ObjIsCi(pObj), iVar1 == 0)) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Aig_Compose_rec(p,pAVar2,pFunc,pVar);
      pAVar2 = Aig_ObjFanin1(pObj);
      Aig_Compose_rec(p,pAVar2,pFunc,pVar);
      pAVar2 = Aig_ObjChild0Copy(pObj);
      p1 = Aig_ObjChild1Copy(pObj);
      pAVar2 = Aig_And(p,pAVar2,p1);
      (pObj->field_5).pData = pAVar2;
      iVar1 = Aig_ObjIsMarkA(pObj);
      if (iVar1 != 0) {
        __assert_fail("!Aig_ObjIsMarkA(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                      ,0x3b7,
                      "void Aig_Compose_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      Aig_ObjSetMarkA(pObj);
    }
    else {
      local_30 = pObj;
      if (pObj == pVar) {
        local_30 = pFunc;
      }
      (pObj->field_5).pData = local_30;
    }
  }
  return;
}

Assistant:

void Aig_Compose_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFunc, Aig_Obj_t * pVar )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsMarkA(pObj) )
        return;
    if ( Aig_ObjIsConst1(pObj) || Aig_ObjIsCi(pObj) )
    {
        pObj->pData = pObj == pVar ? pFunc : pObj;
        return;
    }
    Aig_Compose_rec( p, Aig_ObjFanin0(pObj), pFunc, pVar ); 
    Aig_Compose_rec( p, Aig_ObjFanin1(pObj), pFunc, pVar );
    pObj->pData = Aig_And( p, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    assert( !Aig_ObjIsMarkA(pObj) ); // loop detection
    Aig_ObjSetMarkA( pObj );
}